

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O3

void __thiscall lightconf::scanner::skip_whitespace(scanner *this,bool ignore_comments)

{
  double *pdVar1;
  token_type tVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  pointer pcVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  ulong uVar10;
  pointer ptVar11;
  undefined8 uVar12;
  ulong uVar13;
  pointer ptVar14;
  undefined7 in_register_00000031;
  uint uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  bool bVar17;
  token tok;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  double local_98;
  uint uStack_90;
  int iStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_7c;
  _Any_data *local_78;
  token_type local_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  double local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_7c = (undefined4)CONCAT71(in_register_00000031,ignore_comments);
  local_78 = (_Any_data *)&this->params_;
  uVar13 = (ulong)this->cur_token_;
  ptVar14 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ptVar11 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    uVar10 = (long)ptVar11 - (long)ptVar14 >> 6;
    if (uVar10 == uVar13) {
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_98 = 0.0;
      uStack_90 = uStack_90 & 0xffffff00;
      iStack_8c = 0;
      uStack_88 = 0;
      uStack_84 = 0;
LAB_0010f373:
      if (uVar10 == uVar13) {
        bVar17 = false;
      }
      else {
        local_70 = ptVar14[uVar13].type;
        pcVar6 = ptVar14[uVar13].string_value._M_dataplus._M_p;
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_68,pcVar6,pcVar6 + ptVar14[uVar13].string_value._M_string_length)
        ;
        local_38._0_4_ = ptVar14[uVar13].line;
        local_38._4_4_ = ptVar14[uVar13].col;
        local_48 = ptVar14[uVar13].number_value;
        ptVar14 = ptVar14 + uVar13;
        uStack_40._0_1_ = ptVar14->char_value;
        uStack_40._1_3_ = *(undefined3 *)&ptVar14->field_0x31;
        uStack_40._4_4_ = ptVar14->pos;
        bVar17 = local_70 == comment_token;
        if (local_68[0] != local_58) {
          operator_delete(local_68[0]);
        }
      }
    }
    else {
      tVar2 = ptVar14[uVar13].type;
      pcVar6 = ptVar14[uVar13].string_value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar6,pcVar6 + ptVar14[uVar13].string_value._M_string_length);
      uVar3 = ptVar14[uVar13].line;
      uVar7 = ptVar14[uVar13].col;
      local_98 = ptVar14[uVar13].number_value;
      uVar12 = (&ptVar14[uVar13].number_value)[1];
      uStack_90 = (uint)uVar12;
      iStack_8c = (int)((ulong)uVar12 >> 0x20);
      bVar17 = true;
      uStack_88 = uVar3;
      uStack_84 = uVar7;
      if (tVar2 != whitespace_token) {
        uVar13 = (ulong)this->cur_token_;
        ptVar14 = (this->tokens_).
                  super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar10 = (long)(this->tokens_).
                       super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)ptVar14 >> 6;
        goto LAB_0010f373;
      }
    }
    paVar16 = &local_b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar16) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if (!bVar17) {
      return;
    }
    uVar13 = (ulong)this->cur_token_;
    ptVar14 = (this->tokens_).
              super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)(this->tokens_).
              super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)ptVar14 >> 6 == uVar13) {
LAB_0010f52d:
      uVar13 = (ulong)this->cur_token_;
      ptVar14 = (this->tokens_).
                super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                super__Vector_impl_data._M_start;
      ptVar11 = (this->tokens_).
                super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    else {
      tVar2 = ptVar14[uVar13].type;
      pcVar6 = ptVar14[uVar13].string_value._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar6,pcVar6 + ptVar14[uVar13].string_value._M_string_length);
      uVar4 = ptVar14[uVar13].line;
      uVar8 = ptVar14[uVar13].col;
      pdVar1 = &ptVar14[uVar13].number_value;
      local_98 = *pdVar1;
      uStack_90 = *(uint *)(pdVar1 + 1);
      iStack_8c = *(int *)((long)pdVar1 + 0xc);
      uStack_88 = uVar4;
      uStack_84 = uVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar16) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      uVar13 = (ulong)this->cur_token_;
      ptVar14 = (this->tokens_).
                super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                super__Vector_impl_data._M_start;
      ptVar11 = (this->tokens_).
                super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((this->params_).comment_function.super__Function_base._M_manager != (_Manager_type)0x0 &&
          (tVar2 == comment_token && (char)local_7c == '\0')) {
        if ((long)ptVar11 - (long)ptVar14 >> 6 == uVar13) {
          local_b8._M_string_length = 0;
          local_b8.field_2._M_local_buf[0] = '\0';
          local_98 = 0.0;
          uStack_90 = uStack_90 & 0xffffff00;
          iStack_8c = 0;
          uStack_88 = 0;
          uStack_84 = 0;
          local_b8._M_dataplus._M_p = (pointer)paVar16;
        }
        else {
          pcVar6 = ptVar14[uVar13].string_value._M_dataplus._M_p;
          local_b8._M_dataplus._M_p = (pointer)paVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,pcVar6,
                     pcVar6 + ptVar14[uVar13].string_value._M_string_length);
          uVar5 = ptVar14[uVar13].line;
          uVar9 = ptVar14[uVar13].col;
          local_98 = ptVar14[uVar13].number_value;
          uVar12 = (&ptVar14[uVar13].number_value)[1];
          uStack_90 = (uint)uVar12;
          iStack_8c = (int)((ulong)uVar12 >> 0x20);
          uStack_88 = uVar5;
          uStack_84 = uVar9;
          if ((this->params_).comment_function.super__Function_base._M_manager == (_Manager_type)0x0
             ) {
            uVar12 = std::__throw_bad_function_call();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
            _Unwind_Resume(uVar12);
          }
        }
        (*(this->params_).comment_function._M_invoker)(local_78,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar16) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        goto LAB_0010f52d;
      }
    }
    if (uVar13 <= ((long)ptVar11 - (long)ptVar14 >> 6) - 1U) {
      uVar15 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar15;
      this->cur_token_ = uVar15;
    }
  } while( true );
}

Assistant:

inline void scanner::skip_whitespace(bool ignore_comments) {
    while (cur_token().type == token_type::whitespace_token || cur_token().type == token_type::comment_token) {
        if (cur_token().type == token_type::comment_token && !ignore_comments) {
            if (params_.comment_function) {
                params_.comment_function(cur_token().string_value);
            }
        }
        next_token();
    }
}